

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

bool __thiscall base_uint<256U>::EqualTo(base_uint<256U> *this,uint64_t b)

{
  ulong in_RSI;
  uint *in_RDI;
  long in_FS_OFFSET;
  int i;
  int local_24;
  bool local_9;
  
  local_24 = 7;
  do {
    if (local_24 < 2) {
      if ((ulong)in_RDI[1] == in_RSI >> 0x20) {
        if ((ulong)*in_RDI == (in_RSI & 0xffffffff)) {
          local_9 = true;
        }
        else {
          local_9 = false;
        }
      }
      else {
        local_9 = false;
      }
LAB_00e7dda3:
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        return local_9;
      }
      __stack_chk_fail();
    }
    if (in_RDI[local_24] != 0) {
      local_9 = false;
      goto LAB_00e7dda3;
    }
    local_24 = local_24 + -1;
  } while( true );
}

Assistant:

bool base_uint<BITS>::EqualTo(uint64_t b) const
{
    for (int i = WIDTH - 1; i >= 2; i--) {
        if (pn[i])
            return false;
    }
    if (pn[1] != (b >> 32))
        return false;
    if (pn[0] != (b & 0xfffffffful))
        return false;
    return true;
}